

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

bool absl::lts_20240722::anon_unknown_8::FindTransition
               (time_zone *tz,offset_in_time_zone_to_subr find_transition,Time t,
               CivilTransition *trans)

{
  char cVar1;
  undefined8 *puVar2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tp;
  undefined8 local_30;
  undefined4 local_28;
  uint uStack_24;
  undefined8 local_20;
  undefined4 local_18;
  uint uStack_14;
  HiRep local_10;
  
  puVar2 = (undefined8 *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),t.rep_.rep_lo_);
  local_10 = t.rep_.rep_hi_;
  local_30 = 0x7b2;
  local_28 = 0x101;
  uStack_24 = uStack_24 & 0xffffff00;
  local_20 = 0x7b2;
  local_18 = 0x101;
  uStack_14 = uStack_14 & 0xffffff00;
  if ((find_transition & 1) != 0) {
    find_transition = *(undefined8 *)(*(long *)tz + -1 + find_transition);
  }
  cVar1 = (*(code *)find_transition)(tz,&local_10,&local_30);
  if (cVar1 != '\0') {
    *puVar2 = local_30;
    *(undefined4 *)(puVar2 + 1) = local_28;
    *(char *)((long)puVar2 + 0xc) = (char)uStack_24;
    puVar2[2] = local_20;
    *(undefined4 *)(puVar2 + 3) = local_18;
    *(char *)((long)puVar2 + 0x1c) = (char)uStack_14;
  }
  return (bool)cVar1;
}

Assistant:

bool FindTransition(const cctz::time_zone& tz,
                    bool (cctz::time_zone::*find_transition)(
                        const cctz::time_point<cctz::seconds>& tp,
                        cctz::time_zone::civil_transition* trans) const,
                    Time t, TimeZone::CivilTransition* trans) {
  // Transitions are second-aligned, so we can discard any fractional part.
  const auto tp = unix_epoch() + cctz::seconds(ToUnixSeconds(t));
  cctz::time_zone::civil_transition tr;
  if (!(tz.*find_transition)(tp, &tr)) return false;
  trans->from = CivilSecond(tr.from);
  trans->to = CivilSecond(tr.to);
  return true;
}